

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variance.c
# Opt level: O2

void aom_comp_mask_pred_c
               (uint8_t *comp_pred,uint8_t *pred,int width,int height,uint8_t *ref,int ref_stride,
               uint8_t *mask,int mask_stride,int invert_mask)

{
  int iVar1;
  int iVar2;
  uint8_t *puVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  
  iVar2 = 0;
  iVar4 = ref_stride;
  puVar3 = ref;
  iVar1 = width;
  if (invert_mask == 0) {
    iVar4 = width;
    puVar3 = pred;
    iVar1 = ref_stride;
    pred = ref;
  }
  uVar5 = 0;
  if (0 < width) {
    uVar5 = (ulong)(uint)width;
  }
  if (height < 1) {
    height = 0;
  }
  for (; iVar2 != height; iVar2 = iVar2 + 1) {
    for (uVar6 = 0; uVar5 != uVar6; uVar6 = uVar6 + 1) {
      comp_pred[uVar6] =
           (uint8_t)((uint)puVar3[uVar6] * (0x40 - (uint)mask[uVar6]) +
                     (uint)pred[uVar6] * (uint)mask[uVar6] + 0x20 >> 6);
    }
    comp_pred = comp_pred + width;
    pred = pred + iVar1;
    puVar3 = puVar3 + iVar4;
    mask = mask + mask_stride;
  }
  return;
}

Assistant:

void aom_comp_mask_pred_c(uint8_t *comp_pred, const uint8_t *pred, int width,
                          int height, const uint8_t *ref, int ref_stride,
                          const uint8_t *mask, int mask_stride,
                          int invert_mask) {
  int i, j;
  const uint8_t *src0 = invert_mask ? pred : ref;
  const uint8_t *src1 = invert_mask ? ref : pred;
  const int stride0 = invert_mask ? width : ref_stride;
  const int stride1 = invert_mask ? ref_stride : width;
  for (i = 0; i < height; ++i) {
    for (j = 0; j < width; ++j) {
      comp_pred[j] = AOM_BLEND_A64(mask[j], src0[j], src1[j]);
    }
    comp_pred += width;
    src0 += stride0;
    src1 += stride1;
    mask += mask_stride;
  }
}